

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetTime(Cluster *this)

{
  SegmentInfo *this_00;
  longlong lVar1;
  longlong t;
  longlong scale;
  SegmentInfo *pInfo;
  longlong tc;
  Cluster *this_local;
  
  this_local = (Cluster *)GetTimeCode(this);
  if (-1 < (long)this_local) {
    this_00 = Segment::GetInfo(this->m_pSegment);
    if (this_00 == (SegmentInfo *)0x0) {
      __assert_fail("pInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bc8,"long long mkvparser::Cluster::GetTime() const");
    }
    lVar1 = SegmentInfo::GetTimeCodeScale(this_00);
    if (lVar1 < 1) {
      __assert_fail("scale >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bcb,"long long mkvparser::Cluster::GetTime() const");
    }
    this_local = (Cluster *)(this->m_timecode * lVar1);
  }
  return (longlong)this_local;
}

Assistant:

long long Cluster::GetTime() const {
  const long long tc = GetTimeCode();

  if (tc < 0)
    return tc;

  const SegmentInfo* const pInfo = m_pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long t = m_timecode * scale;

  return t;
}